

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::percolateDown
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  int y;
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  
  y = (this->heap).data[i];
  do {
    iVar2 = i * 2 + 1;
    iVar1 = (this->heap).sz;
    if (iVar1 <= iVar2) break;
    iVar5 = i * 2 + 2;
    if ((iVar1 <= iVar5) ||
       (piVar3 = (this->heap).data,
       bVar4 = Solver::VarOrderLt::operator()(&this->lt,piVar3[iVar5],piVar3[iVar2]), !bVar4)) {
      iVar5 = iVar2;
    }
    bVar4 = Solver::VarOrderLt::operator()(&this->lt,(this->heap).data[iVar5],y);
    if (bVar4) {
      piVar3 = (this->heap).data;
      iVar2 = piVar3[iVar5];
      piVar3[i] = iVar2;
      if ((this->indices).map.sz <= iVar2) goto LAB_0010f676;
      (this->indices).map.data[iVar2] = i;
      i = iVar5;
    }
  } while (bVar4);
  (this->heap).data[i] = y;
  if (y < (this->indices).map.sz) {
    (this->indices).map.data[y] = i;
    return;
  }
LAB_0010f676:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void percolateDown(int i)
    {
        K x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }